

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::shadePrimitives
          (VertexExpanderShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  Vec4 *a;
  GenericVec4 *varyings;
  VertexPacket *pVVar1;
  GeometryEmitter *this_00;
  PrimitivePacket *pPVar2;
  ulong uVar3;
  Vec4 yoffset;
  Vector<float,_4> local_d8;
  VertexPacket **local_c8;
  ulong local_c0;
  PrimitivePacket *local_b8;
  ulong local_b0;
  ulong local_a8;
  GeometryEmitter *local_a0;
  PrimitivePacket *local_98;
  ulong local_90;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  tcu local_40 [16];
  
  local_a8 = 0;
  local_90 = (ulong)(uint)verticesIn;
  if (verticesIn < 1) {
    local_90 = local_a8;
  }
  local_b0 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_b0 = local_a8;
  }
  local_c8 = packets->vertices;
  local_b8 = packets;
  local_a0 = output;
  for (; local_a8 != local_b0; local_a8 = local_a8 + 1) {
    local_98 = local_b8 + local_a8;
    for (uVar3 = 0; pPVar2 = local_98, local_90 != uVar3; uVar3 = uVar3 + 1) {
      local_78.m_data[0] = -0.07;
      local_78.m_data[1] = -0.01;
      local_78.m_data[2] = 0.0;
      local_78.m_data[3] = 0.0;
      local_68.m_data[0] = 0.03;
      local_68.m_data[1] = -0.03;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      local_58.m_data[0] = -0.01;
      local_58.m_data[1] = 0.08;
      local_58.m_data[2] = 0.0;
      local_58.m_data[3] = 0.0;
      local_d8.m_data[0] = 0.02;
      local_d8.m_data[1] = 0.1;
      local_d8.m_data[2] = 0.0;
      local_d8.m_data[3] = 0.0;
      tcu::operator*((tcu *)&local_88,(float)local_98->primitiveIDIn,&local_d8);
      pVVar1 = local_c8[uVar3];
      a = &pVVar1->position;
      local_c0 = uVar3;
      tcu::operator+(local_40,a,&local_78);
      tcu::operator+((tcu *)&local_d8,(Vector<float,_4> *)local_40,&local_88);
      this_00 = local_a0;
      varyings = pVVar1->outputs;
      rr::GeometryEmitter::EmitVertex
                (local_a0,&local_d8,pVVar1->pointSize,varyings,pPVar2->primitiveIDIn);
      tcu::operator+(local_40,a,&local_68);
      tcu::operator+((tcu *)&local_d8,(Vector<float,_4> *)local_40,&local_88);
      rr::GeometryEmitter::EmitVertex
                (this_00,&local_d8,pVVar1->pointSize,varyings,pPVar2->primitiveIDIn);
      tcu::operator+(local_40,a,&local_58);
      tcu::operator+((tcu *)&local_d8,(Vector<float,_4> *)local_40,&local_88);
      uVar3 = local_c0;
      rr::GeometryEmitter::EmitVertex
                (this_00,&local_d8,pVVar1->pointSize,varyings,pPVar2->primitiveIDIn);
      rr::GeometryEmitter::EndPrimitive(this_00);
    }
    local_c8 = local_c8 + 7;
  }
  return;
}

Assistant:

void VertexExpanderShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	for (int ndx = 0; ndx < numPackets; ++ndx)
	for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
	{
		const tcu::Vec4 offsets[] =
		{
			tcu::Vec4(-0.07f, -0.01f, 0.0f, 0.0f),
			tcu::Vec4( 0.03f, -0.03f, 0.0f, 0.0f),
			tcu::Vec4(-0.01f,  0.08f, 0.0f, 0.0f)
		};
		const tcu::Vec4 yoffset = float(packets[ndx].primitiveIDIn) * tcu::Vec4(0.02f, 0.1f, 0, 0);

		// Create new primitive at every input vertice
		const rr::VertexPacket* vertex = packets[ndx].vertices[verticeNdx];

		output.EmitVertex(vertex->position + offsets[0] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[1] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EmitVertex(vertex->position + offsets[2] + yoffset, vertex->pointSize, vertex->outputs, packets[ndx].primitiveIDIn);
		output.EndPrimitive();
	}
}